

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void WindowSizeCallback(GLFWwindow *window,int width,int height)

{
  SetupViewport(width,height);
  CORE.Window.currentFbo.width = width;
  CORE.Window.currentFbo.height = height;
  CORE.Window.resizedLastFrame = true;
  if (CORE.Window.fullscreen == false) {
    CORE.Window.screen.width = width;
    CORE.Window.screen.height = height;
  }
  return;
}

Assistant:

static void WindowSizeCallback(GLFWwindow *window, int width, int height)
{
    SetupViewport(width, height);    // Reset viewport and projection matrix for new size
    CORE.Window.currentFbo.width = width;
    CORE.Window.currentFbo.height = height;
    CORE.Window.resizedLastFrame = true;

    if (IsWindowFullscreen()) return;

    // Set current screen size
    CORE.Window.screen.width = width;
    CORE.Window.screen.height = height;
    // NOTE: Postprocessing texture is not scaled to new size

}